

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void __thiscall Fl_Widget_Type::resizable(Fl_Widget_Type *this,uchar v)

{
  int iVar1;
  Fl_Group *pFVar2;
  Fl_Widget *pFVar3;
  undefined3 in_register_00000031;
  
  iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])();
  pFVar3 = this->o;
  if (CONCAT31(in_register_00000031,v) == 0) {
    if (iVar1 == 0) {
      if (pFVar3->parent_ == (Fl_Group *)0x0) {
        return;
      }
      if (pFVar3->parent_->resizable_ != pFVar3) {
        return;
      }
    }
    else if (pFVar3[1].callback_ == (Fl_Callback *)0x0) {
      return;
    }
    iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
    pFVar2 = (Fl_Group *)this->o;
    if ((iVar1 == 0) &&
       (pFVar2 = *(Fl_Group **)((long)&pFVar2->super_Fl_Widget + 8), pFVar2 == (Fl_Group *)0x0)) {
      return;
    }
    pFVar3 = (Fl_Widget *)0x0;
  }
  else {
    if (iVar1 == 0) {
      if ((pFVar3->parent_ != (Fl_Group *)0x0) && (pFVar3->parent_->resizable_ == pFVar3)) {
        return;
      }
    }
    else if (pFVar3[1].callback_ != (Fl_Callback *)0x0) {
      return;
    }
    iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
    pFVar3 = this->o;
    pFVar2 = (Fl_Group *)pFVar3;
    if ((iVar1 == 0) && (pFVar2 = pFVar3->parent_, pFVar3->parent_ == (Fl_Group *)0x0)) {
      return;
    }
  }
  pFVar2->resizable_ = pFVar3;
  return;
}

Assistant:

void Fl_Widget_Type::resizable(uchar v) {
  if (v) {
    if (resizable()) return;
    if (is_window()) ((Fl_Window*)o)->resizable(o);
    else {
      Fl_Group* p = (Fl_Group*)o->parent();
      if (p) p->resizable(o);
    }
  } else {
    if (!resizable()) return;
    if (is_window()) {
      ((Fl_Window*)o)->resizable(0);
    } else {
      Fl_Group* p = (Fl_Group*)o->parent();
      if (p) p->resizable(0);
    }
  }
}